

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Var * __thiscall kratos::VarSlice::get_var_root_parent(VarSlice *this)

{
  VarType VVar1;
  element_type *peVar2;
  undefined1 local_28 [24];
  Var *parent;
  VarSlice *this_local;
  
  local_28._16_8_ = this->parent_var;
  parent = &this->super_Var;
  while( true ) {
    VVar1 = Var::type((Var *)local_28._16_8_);
    if (VVar1 != Slice) break;
    Var::as<kratos::VarSlice>((Var *)local_28);
    peVar2 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    local_28._16_8_ = peVar2->parent_var;
    std::shared_ptr<kratos::VarSlice>::~shared_ptr((shared_ptr<kratos::VarSlice> *)local_28);
  }
  return (Var *)local_28._16_8_;
}

Assistant:

const Var *VarSlice::get_var_root_parent() const {
    Var *parent = parent_var;
    while (parent->type() == VarType::Slice) {
        parent = parent->as<VarSlice>()->parent_var;
    }
    return parent;
}